

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O1

FieldMap * __thiscall FIX::FieldMap::getGroupRef(FieldMap *this,int num,int tag)

{
  FieldMap *pFVar1;
  FieldNotFound *pFVar2;
  FieldMap *pFVar3;
  FieldMap *pFVar4;
  string local_48;
  
  pFVar4 = this + 0x28;
  pFVar1 = pFVar4;
  for (pFVar3 = *(FieldMap **)(this + 0x30); pFVar3 != (FieldMap *)0x0;
      pFVar3 = *(FieldMap **)(pFVar3 + (ulong)(*(int *)(pFVar3 + 0x20) < tag) * 8 + 0x10)) {
    if (tag <= *(int *)(pFVar3 + 0x20)) {
      pFVar1 = pFVar3;
    }
  }
  pFVar3 = pFVar4;
  if ((pFVar1 != pFVar4) && (pFVar3 = pFVar1, tag < *(int *)(pFVar1 + 0x20))) {
    pFVar3 = pFVar4;
  }
  if (pFVar3 == pFVar4) {
    pFVar2 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    FieldNotFound::FieldNotFound(pFVar2,tag,&local_48);
    __cxa_throw(pFVar2,&FieldNotFound::typeinfo,Exception::~Exception);
  }
  if (num < 1) {
    pFVar2 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    FieldNotFound::FieldNotFound(pFVar2,tag,&local_48);
    __cxa_throw(pFVar2,&FieldNotFound::typeinfo,Exception::~Exception);
  }
  if ((ulong)(uint)num <= (ulong)(*(long *)(pFVar3 + 0x30) - *(long *)(pFVar3 + 0x28) >> 3)) {
    return *(FieldMap **)(*(long *)(pFVar3 + 0x28) + -8 + (ulong)(uint)num * 8);
  }
  pFVar2 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  FieldNotFound::FieldNotFound(pFVar2,tag,&local_48);
  __cxa_throw(pFVar2,&FieldNotFound::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldNotFound) {
    Groups::const_iterator tagWithGroups = m_groups.find(tag);
    if (tagWithGroups == m_groups.end()) {
      throw FieldNotFound(tag);
    }
    if (num <= 0) {
      throw FieldNotFound(tag);
    }
    if (tagWithGroups->second.size() < static_cast<unsigned>(num)) {
      throw FieldNotFound(tag);
    }
    return *(*(tagWithGroups->second.begin() + (num - 1)));
  }